

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi00.hpp
# Opt level: O2

size_t __thiscall
websocketpp::processor::hybi00<websocketpp::config::asio>::consume
          (hybi00<websocketpp::config::asio> *this,uint8_t *buf,size_t len,error_code *ec)

{
  state sVar1;
  error_category *peVar2;
  uchar *puVar3;
  ulong uVar4;
  uint8_t *payload;
  __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  uVar4 = 0;
LAB_001c2af9:
  if (uVar4 < len) {
    if (this->m_state == PAYLOAD) goto LAB_001c2b60;
    if (this->m_state == HEADER) {
      if (buf[uVar4] == this->msg_hdr) {
        uVar4 = uVar4 + 1;
        message_buffer::alloc::
        con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::get_message((con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                       *)&local_40,
                      (value)(this->m_msg_manager).
                             super___shared_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,1);
        std::
        __shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&(this->m_msg_ptr).
                     super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                    ,&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        if ((this->m_msg_ptr).
            super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          peVar2 = websocketpp::error::get_category();
          ec->_M_value = 8;
          goto LAB_001c2bd8;
        }
        sVar1 = PAYLOAD;
      }
      else {
        peVar2 = error::get_processor_category();
        ec->_M_value = 3;
LAB_001c2bd8:
        ec->_M_cat = peVar2;
        sVar1 = FATAL_ERROR;
      }
      goto LAB_001c2bdf;
    }
  }
  return uVar4;
LAB_001c2b60:
  payload = buf + uVar4;
  puVar3 = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                     (payload,buf + len,&this->msg_ftr);
  message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::append_payload
            ((this->m_msg_ptr).
             super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,payload,(long)puVar3 - (long)payload);
  uVar4 = uVar4 + ((long)puVar3 - (long)payload);
  if (puVar3 != buf + len) {
    uVar4 = uVar4 + 1;
    sVar1 = READY;
LAB_001c2bdf:
    this->m_state = sVar1;
  }
  goto LAB_001c2af9;
}

Assistant:

size_t consume(uint8_t * buf, size_t len, lib::error_code & ec) {
        // if in state header we are expecting a 0x00 byte, if we don't get one
        // it is a fatal error
        size_t p = 0; // bytes processed
        size_t l = 0;

        ec = lib::error_code();

        while (p < len) {
            if (m_state == HEADER) {
                if (buf[p] == msg_hdr) {
                    p++;
                    m_msg_ptr = m_msg_manager->get_message(frame::opcode::text,1);

                    if (!m_msg_ptr) {
                        ec = make_error_code(websocketpp::error::no_incoming_buffers);
                        m_state = FATAL_ERROR;
                    } else {
                        m_state = PAYLOAD;
                    }
                } else {
                    ec = make_error_code(error::protocol_violation);
                    m_state = FATAL_ERROR;
                }
            } else if (m_state == PAYLOAD) {
                uint8_t *it = std::find(buf+p,buf+len,msg_ftr);

                // 0    1    2    3    4    5
                // 0x00 0x23 0x23 0x23 0xff 0xXX

                // Copy payload bytes into message
                l = static_cast<size_t>(it-(buf+p));
                m_msg_ptr->append_payload(buf+p,l);
                p += l;

                if (it != buf+len) {
                    // message is done, copy it and the trailing
                    p++;
                    // TODO: validation
                    m_state = READY;
                }
            } else {
                // TODO
                break;
            }
        }
        // If we get one, we create a new message and move to application state

        // if in state application we are copying bytes into the output message
        // and validating them for UTF8 until we hit a 0xff byte. Once we hit
        // 0x00, the message is complete and is dispatched. Then we go back to
        // header state.

        //ec = make_error_code(error::not_implemented);
        return p;
    }